

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O2

void __thiscall cursespp::ListOverlay::ListOverlay(ListOverlay *this)

{
  shared_ptr<cursespp::Window> *this_00;
  shared_ptr<cursespp::ListOverlay::CustomListWindow> *this_01;
  element_type *peVar1;
  element_type *peVar2;
  Window *this_02;
  CustomListWindow *this_03;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  OverlayBase::OverlayBase(&this->super_OverlayBase);
  sigslot::has_slots<sigslot::multi_threaded_local>::has_slots
            (&this->super_has_slots<sigslot::multi_threaded_local>);
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__ListOverlay_001c0010;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&DAT_001c0298;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__ListOverlay_001c02c8;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ListOverlay_001c02f0;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__ListOverlay_001c0318;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ListOverlay_001c03c0;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ListOverlay_001c03e8;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ListOverlay_001c0410;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ListOverlay_001c0440;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay = (_func_int **)&PTR__ListOverlay_001c0470
  ;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__ListOverlay_001c0498;
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  memset(&this->adapter,0,0xb0);
  Window::SetFrameVisible((Window *)this,true);
  local_78 = 0x1600;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[10])(this);
  local_80 = 0x1700;
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[9])(this);
  this->autoDismiss = true;
  this->width = 0;
  this->height = 0;
  this->setWidth = 0;
  this->setWidthPercent = 0;
  this_02 = (Window *)operator_new(0x110);
  Window::Window(this_02,(IWindow *)0x0);
  this_00 = &this->scrollbar;
  std::__shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>::reset<cursespp::Window>
            (&this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>,this_02);
  peVar1 = (this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*(peVar1->super_IWindow).super_IOrderable._vptr_IOrderable[0x11])(peVar1,0);
  local_88 = 0x1700;
  (*(((this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
    super_IWindow).super_IOrderable._vptr_IOrderable[9])();
  this_03 = (CustomListWindow *)operator_new(0x318);
  local_50._8_8_ = 0;
  local_38 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:96:22)>
             ::_M_invoke;
  local_70._8_8_ = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:96:22)>
             ::_M_manager;
  local_58 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:102:27)>
             ::_M_invoke;
  local_60 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/clangen[P]cursespp/src/ListOverlay.cpp:102:27)>
             ::_M_manager;
  local_70._M_unused._M_object = this;
  local_50._M_unused._M_object = this;
  CustomListWindow::CustomListWindow(this_03,(Callback *)&local_50,(Callback *)&local_70);
  this_01 = &this->listWindow;
  std::__shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>::
  reset<cursespp::ListOverlay::CustomListWindow>
            (&this_01->
              super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ,this_03);
  std::_Function_base::~_Function_base((_Function_base *)&local_70);
  std::_Function_base::~_Function_base((_Function_base *)&local_50);
  local_90 = 0x1700;
  (**(code **)(*(long *)&(((this_01->
                           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x48))();
  local_98 = 0x1700;
  (**(code **)(*(long *)&(((this_01->
                           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x60))();
  peVar2 = (this_01->
           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (**(code **)(*(long *)&(peVar2->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x88))(peVar2,0);
  sigslot::signal2<cursespp::ListWindow_*,_unsigned_long,_sigslot::multi_threaded_local>::
  connect<cursespp::ListOverlay>
            (&(((this->listWindow).
                super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->super_ListWindow).EntryActivated,this,
             (offset_in_ListOverlay_to_subr)OnListEntryActivated);
  peVar2 = (this_01->
           super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  (**(code **)(*(long *)&(peVar2->super_ListWindow).super_ScrollableWindow.super_Window.
                         super_IWindow.super_IOrderable + 0x100))(peVar2,0);
  std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::Window,void>
            (local_a8,&this_00->super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>);
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[0x46])(this,local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__shared_ptr<cursespp::IWindow,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cursespp::ListOverlay::CustomListWindow,void>
            (local_b8,&this_01->
                       super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
            );
  (*(this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
    _vptr_IOrderable[0x46])(this,local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  return;
}

Assistant:

ListOverlay::ListOverlay() {
    this->SetFrameVisible(true);
    this->SetFrameColor(Color::OverlayFrame);
    this->SetContentColor(Color::OverlayContent);

    this->autoDismiss = true;

    this->width = this->height = 0;
    this->setWidth = this->setWidthPercent = 0;

    auto decorator = [this] {
        if (this->ScrollbarVisible()) {
            Scrollbar::Draw(this->listWindow.get(), this->scrollbar.get());
        }
    };

    auto adapterChanged = [this] { this->Layout(); };

    this->scrollbar.reset(new Window());
    this->scrollbar->SetFrameVisible(false);
    this->scrollbar->SetContentColor(Color::OverlayContent);

    this->listWindow.reset(new CustomListWindow(decorator, adapterChanged));
    this->listWindow->SetContentColor(Color::OverlayContent);
    this->listWindow->SetFocusedContentColor(Color::OverlayContent);
    this->listWindow->SetFrameVisible(false);
    this->listWindow->EntryActivated.connect(this, &ListOverlay::OnListEntryActivated);

    this->listWindow->SetFocusOrder(0);
    this->AddWindow(this->scrollbar);
    this->AddWindow(this->listWindow);
}